

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

C * __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::createBuffer
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t length,
          bool saveContents)

{
  long lVar1;
  size_t sVar2;
  RefCount **refCount;
  BufHdr *pBVar3;
  BufHdr *pBVar4;
  byte in_DL;
  BufHdr *in_RSI;
  BufHdr *in_RDI;
  size_t copyLength;
  C *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  size_t size;
  BufHdr *in_stack_ffffffffffffff78;
  BufHdr *in_stack_ffffffffffffff80;
  Ptr local_40 [16];
  size_t local_30;
  ulong local_28;
  byte local_19;
  BufHdr *local_18;
  BufHdr *local_8;
  
  local_19 = in_DL & 1;
  local_28 = (long)((long)&(in_RSI->super_RefCount)._vptr_RefCount + 1) * 4;
  local_18 = in_RSI;
  if ((((in_RDI->super_RefCount).m_freeFunc != (FreeFunc *)0x0) &&
      (local_28 <= *(ulong *)((in_RDI->super_RefCount).m_freeFunc + 0x18))) &&
     (sVar2 = rc::RefCount::getRefCount((RefCount *)(in_RDI->super_RefCount).m_freeFunc), sVar2 == 1
     )) {
    lVar1._0_4_ = (in_RDI->super_RefCount).m_refCount;
    lVar1._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
    if ((lVar1 == 0) || ((local_19 & 1) == 0)) {
      (in_RDI->super_RefCount)._vptr_RefCount =
           (_func_int **)((in_RDI->super_RefCount).m_freeFunc + 0x28);
    }
    sVar2 = rc::BufHdr::getLeftoverBufferSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (local_28 <= sVar2) {
      *(BufHdr **)&(in_RDI->super_RefCount).m_refCount = local_18;
      *(undefined4 *)((long)(in_RDI->super_RefCount)._vptr_RefCount + (long)local_18 * 4) = 0;
      *(undefined1 *)&in_RDI->m_bufferSize = 1;
      return (C *)(in_RDI->super_RefCount)._vptr_RefCount;
    }
  }
  local_30 = getAllocSize(0x1336c4);
  refCount = (RefCount **)mem::allocate(0x1336d7);
  rc::BufHdr::BufHdr(in_RDI,(size_t)refCount,(uintptr_t)in_stack_ffffffffffffff80);
  rc::primeRefCount<axl::rc::BufHdr>
            (in_stack_ffffffffffffff80,(FreeFunc *)in_stack_ffffffffffffff78);
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
            ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pBVar3 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
  if (pBVar3 == (BufHdr *)0x0) {
    local_8 = (BufHdr *)0x0;
  }
  else {
    pBVar3 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
    pBVar3 = pBVar3 + 1;
    if (((local_19 & 1) != 0) && ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0)) {
      in_stack_ffffffffffffff80 = local_18;
      if (*(BufHdr **)&(in_RDI->super_RefCount).m_refCount <= local_18) {
        in_stack_ffffffffffffff80 = *(BufHdr **)&(in_RDI->super_RefCount).m_refCount;
      }
      StringDetailsImpl<wchar_t>::copy
                ((EVP_PKEY_CTX *)pBVar3,(EVP_PKEY_CTX *)(in_RDI->super_RefCount)._vptr_RefCount);
    }
    if ((in_RDI->super_RefCount).m_freeFunc != (FreeFunc *)0x0) {
      rc::RefCount::release(&in_stack_ffffffffffffff80->super_RefCount);
    }
    *(undefined4 *)((long)&(pBVar3->super_RefCount)._vptr_RefCount + (long)local_18 * 4) = 0;
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pBVar3;
    pBVar4 = rc::Ptr<axl::rc::BufHdr>::detach((Ptr<axl::rc::BufHdr> *)in_RDI,refCount);
    (in_RDI->super_RefCount).m_freeFunc = (FreeFunc *)pBVar4;
    *(BufHdr **)&(in_RDI->super_RefCount).m_refCount = local_18;
    *(undefined1 *)&in_RDI->m_bufferSize = 1;
    local_8 = pBVar3;
  }
  rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x133847);
  return (C *)local_8;
}

Assistant:

C*
	createBuffer(
		size_t length,
		bool saveContents = false
	) {
		size_t size = (length + 1) * sizeof(C);

		if (this->m_hdr &&
			this->m_hdr->m_bufferSize >= size &&
			this->m_hdr->getRefCount() == 1) {
			if (!this->m_length || !saveContents)
				this->m_p = (C*)(this->m_hdr + 1);

			if (this->m_hdr->getLeftoverBufferSize(this->m_p) >= size) {
				this->m_length = length;
				this->m_p[length] = 0;
				this->m_isNullTerminated = true;
				return this->m_p;
			}
		}

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_EXTRA(rc::BufHdr, (bufferSize), bufferSize);
		if (!hdr)
			return NULL;

		C* p = (C*)(hdr + 1);

		if (saveContents && this->m_p) {
			size_t copyLength = AXL_MIN(length, this->m_length);
			Details::copy(p, this->m_p, copyLength);
		}

		if (this->m_hdr)
			this->m_hdr->release();

		p[length] = 0; // ensure zero termination

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_length = length;
		this->m_isNullTerminated = true;
		return p;
	}